

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestOneof2_NestedMessage::_InternalSerialize
          (TestOneof2_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  int iVar2;
  uint8_t *puVar3;
  const_pointer piVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  LogMessageFatal local_40;
  
  if ((undefined1  [40])((undefined1  [40])this->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.moo_int_,target);
  }
  uVar7 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar7) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar3) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    this_00 = &(this->field_0)._impl_.corge_int_;
    *puVar3 = '\x12';
    target = puVar3 + 2;
    for (; 0x7f < uVar7; uVar7 = uVar7 >> 7) {
      target[-1] = (byte)uVar7 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar7;
    piVar4 = google::protobuf::RepeatedField<int>::data(this_00);
    iVar2 = google::protobuf::RepeatedField<int>::size(this_00);
    piVar1 = piVar4 + iVar2;
    do {
      pbVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      for (uVar6 = (ulong)*piVar4; target = pbVar5 + 1, 0x7f < uVar6; uVar6 = uVar6 >> 7) {
        *pbVar5 = (byte)uVar6 | 0x80;
        pbVar5 = target;
      }
      piVar4 = piVar4 + 1;
      *pbVar5 = (byte)uVar6;
    } while (piVar4 < piVar1);
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestOneof2_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestOneof2.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int64 moo_int = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<1>(
            stream, this_._internal_moo_int(), target);
  }

  // repeated int32 corge_int = 2;
  {
    int byte_size = this_._impl_._corge_int_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_corge_int(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestOneof2.NestedMessage)
  return target;
}